

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.h
# Opt level: O3

void __thiscall free_format_parser::HMpsFF::~HMpsFF(HMpsFF *this)

{
  pointer pcVar1;
  pointer pdVar2;
  pointer pCVar3;
  pointer psVar4;
  pointer ppVar5;
  pointer ptVar6;
  pointer piVar7;
  pointer pBVar8;
  pointer pHVar9;
  
  pcVar1 = (this->section_args)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->section_args).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->colname2idx)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->rowname2idx)._M_h);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->cone_entries);
  pdVar2 = (this->cone_param).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pCVar3 = (this->cone_type).
           super__Vector_base<free_format_parser::HMpsFF::ConeType,_std::allocator<free_format_parser::HMpsFF::ConeType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar3 != (pointer)0x0) {
    operator_delete(pCVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->cone_name);
  std::
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::~vector(&this->sos_entries);
  psVar4 = (this->sos_type).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->sos_name);
  ppVar5 = (this->coeffobj).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (ppVar5 != (pointer)0x0) {
    operator_delete(ppVar5);
  }
  std::
  vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
  ::~vector(&this->qrows_entries);
  ptVar6 = (this->q_entries).
           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptVar6 != (pointer)0x0) {
    operator_delete(ptVar6);
  }
  ptVar6 = (this->entries).
           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptVar6 != (pointer)0x0) {
    operator_delete(ptVar6);
  }
  piVar7 = (this->integer_column).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar7 != (pointer)0x0) {
    operator_delete(piVar7);
  }
  pBVar8 = (this->row_type).
           super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar8 != (pointer)0x0) {
    operator_delete(pBVar8);
  }
  pcVar1 = (this->objective_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->objective_name).field_2) {
    operator_delete(pcVar1);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->has_row_entry_).super__Bvector_base<std::allocator<bool>_>);
  pcVar1 = (this->duplicate_col_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->duplicate_col_name_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->duplicate_row_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->duplicate_row_name_).field_2) {
    operator_delete(pcVar1);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->col_binary).super__Bvector_base<std::allocator<bool>_>);
  pdVar2 = (this->q_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar7 = (this->q_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar7 != (pointer)0x0) {
    operator_delete(piVar7);
  }
  piVar7 = (this->q_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar7 != (pointer)0x0) {
    operator_delete(piVar7);
  }
  pHVar9 = (this->col_integrality).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pHVar9 != (pointer)0x0) {
    operator_delete(pHVar9);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->col_names);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->row_names);
  pdVar2 = (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->col_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->col_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->col_cost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->a_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar7 = (this->a_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar7 != (pointer)0x0) {
    operator_delete(piVar7);
  }
  piVar7 = (this->a_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar7 != (pointer)0x0) {
    operator_delete(piVar7);
  }
  pcVar1 = (this->mps_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mps_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

HMpsFF() {}